

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

Image * __thiscall aeron::Image::operator=(Image *this,Image *image)

{
  bool __i;
  Image *in_RSI;
  Image *in_RDI;
  array<aeron::concurrent::AtomicBuffer,_3UL> *unaff_retaddr;
  
  std::array<aeron::concurrent::AtomicBuffer,_3UL>::operator=
            (unaff_retaddr,(array<aeron::concurrent::AtomicBuffer,_3UL> *)in_RDI);
  concurrent::logbuffer::Header::operator=((Header *)in_RSI,(Header *)in_RDI);
  concurrent::status::Position<aeron::concurrent::status::UnsafeBufferPosition>::operator=
            ((Position<aeron::concurrent::status::UnsafeBufferPosition> *)in_RSI,
             (Position<aeron::concurrent::status::UnsafeBufferPosition> *)in_RDI);
  std::shared_ptr<aeron::LogBuffers>::operator=
            ((shared_ptr<aeron::LogBuffers> *)in_RSI,(shared_ptr<aeron::LogBuffers> *)in_RDI);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->m_sourceIdentity,(string *)&in_RSI->m_sourceIdentity);
  __i = isClosed(in_RSI);
  std::atomic<bool>::operator=(&in_RDI->m_isClosed,__i);
  std::function<void_(const_std::exception_&)>::operator=
            ((function<void_(const_std::exception_&)> *)this,
             (function<void_(const_std::exception_&)> *)image);
  in_RDI->m_correlationId = in_RSI->m_correlationId;
  in_RDI->m_subscriptionRegistrationId = in_RSI->m_subscriptionRegistrationId;
  in_RDI->m_joinPosition = in_RSI->m_joinPosition;
  in_RDI->m_finalPosition = in_RSI->m_finalPosition;
  in_RDI->m_sessionId = in_RSI->m_sessionId;
  in_RDI->m_termLengthMask = in_RSI->m_termLengthMask;
  in_RDI->m_positionBitsToShift = in_RSI->m_positionBitsToShift;
  in_RDI->m_isEos = (bool)(in_RSI->m_isEos & 1);
  return in_RDI;
}

Assistant:

Image& operator=(const Image& image)
    {
        m_termBuffers = image.m_termBuffers;
        m_header = image.m_header;
        m_subscriberPosition = image.m_subscriberPosition;
        m_logBuffers = image.m_logBuffers;
        m_sourceIdentity = image.m_sourceIdentity;
        m_isClosed = image.isClosed();
        m_exceptionHandler = image.m_exceptionHandler;
        m_correlationId = image.m_correlationId;
        m_subscriptionRegistrationId = image.m_subscriptionRegistrationId;
        m_joinPosition = image.m_joinPosition;
        m_finalPosition = image.m_finalPosition;
        m_sessionId = image.m_sessionId;
        m_termLengthMask = image.m_termLengthMask;
        m_positionBitsToShift = image.m_positionBitsToShift;
        m_isEos = image.m_isEos;

        return *this;
    }